

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O0

int poptGlob(poptContext con,char *pattern,int *acp,char ***avp)

{
  int iVar1;
  char **ppcVar2;
  size_t sVar3;
  char *pcVar4;
  glob_t *pglob;
  glob_t _g;
  int rc;
  char *pat;
  char ***avp_local;
  int *acp_local;
  char *pattern_local;
  poptContext con_local;
  
  _g.gl_stat._4_4_ = 0;
  iVar1 = glob_pattern_p(pattern,0);
  if (iVar1 == 0) {
    if (acp != (int *)0x0) {
      *acp = 1;
    }
    if (avp != (char ***)0x0) {
      ppcVar2 = (char **)calloc(2,8);
      *avp = ppcVar2;
      if (ppcVar2 != (char **)0x0) {
        sVar3 = strlen(pattern);
        pcVar4 = (char *)malloc(sVar3 + 1);
        if (pcVar4 == (char *)0x0) {
          fprintf(_stderr,"virtual memory exhausted.\n");
          exit(1);
        }
        pcVar4 = strcpy(pcVar4,pattern);
        **avp = pcVar4;
      }
    }
  }
  else {
    _g.gl_stat._4_4_ = glob(pattern,poptGlobFlags,poptGlob_error,(glob_t *)&pglob);
    if (_g.gl_stat._4_4_ == 0) {
      if (acp != (int *)0x0) {
        *acp = (int)pglob;
        pglob = (glob_t *)0x0;
      }
      if (avp != (char ***)0x0) {
        *avp = (char **)_g.gl_pathc;
        _g.gl_pathc = 0;
      }
      globfree((glob_t *)&pglob);
    }
    else if (_g.gl_stat._4_4_ == 3) {
      *avp = (char **)0x0;
      *acp = 0;
      _g.gl_stat._4_4_ = 0;
    }
    else {
      _g.gl_stat._4_4_ = -0x10;
    }
  }
  return _g.gl_stat._4_4_;
}

Assistant:

static int poptGlob(UNUSED(poptContext con), const char * pattern,
		int * acp, const char *** avp)
{
    const char * pat = pattern;
    int rc = 0;		/* assume success */

#if defined(HAVE_GLOB_H)
    if (glob_pattern_p(pat, 0)) {
	glob_t _g, *pglob = &_g;

	if (!(rc = glob(pat, poptGlobFlags, poptGlob_error, pglob))) {
	    if (acp) {
		*acp = (int) pglob->gl_pathc;
		pglob->gl_pathc = 0;
	    }
	    if (avp) {
		*avp = (const char **) pglob->gl_pathv;
		pglob->gl_pathv = NULL;
	    }
	    globfree(pglob);
	} else if (rc == GLOB_NOMATCH) {
	    *avp = NULL;
	    *acp = 0;
	    rc = 0;
	} else
	    rc = POPT_ERROR_ERRNO;
    } else
#endif	/* HAVE_GLOB_H */
    {
	if (acp)
	    *acp = 1;
	if (avp && (*avp = calloc((size_t)(1 + 1), sizeof (**avp))) != NULL)
	    (*avp)[0] = xstrdup(pat);
    }

    return rc;
}